

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O0

int __thiscall
qclab::qgates::Phase<std::complex<double>_>::toQASM
          (Phase<std::complex<double>_> *this,ostream *stream,int offset)

{
  int iVar1;
  real_type angle;
  __string_type local_40;
  int local_1c;
  ostream *poStack_18;
  int offset_local;
  ostream *stream_local;
  Phase<std::complex<double>_> *this_local;
  
  iVar1 = (this->super_QGate1<std::complex<double>_>).qubit_;
  local_1c = offset;
  poStack_18 = stream;
  stream_local = (ostream *)this;
  angle = theta(this);
  qasmRz<double>(&local_40,iVar1 + offset,angle);
  std::operator<<(stream,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          stream << qasmRz( this->qubit_ + offset , theta() ) ;
          return 0 ;
        }